

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

Node * __thiscall
Lib::
SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
::pop(SkipList<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_*,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::SListIntermediateNode::NodePtrComparator>
      *this)

{
  uint uVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  
  pNVar2 = (Node *)this->_left->nodes[0];
  uVar1 = this->_top;
  uVar5 = 1;
  uVar6 = uVar5;
  if (1 < uVar1) {
    pNVar4 = this->_left + 1;
    do {
      uVar6 = uVar5;
      if (pNVar4->value != pNVar2) break;
      uVar5 = uVar5 + 1;
      pNVar4 = (Node *)pNVar4->nodes;
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  uVar7 = 0;
  do {
    this->_left->nodes[uVar7] = (Node *)(&pNVar2->_term)[uVar7]._content;
    uVar7 = uVar7 + 1;
  } while (uVar6 != uVar7);
  pNVar3 = (Node *)pNVar2->_vptr_Node;
  uVar7 = (ulong)(uVar6 - 1) * 8 + 0x1f & 0xffffffff0;
  if (uVar7 == 0) {
    pNVar2->_vptr_Node = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pNVar2;
  }
  else if (uVar7 < 0x11) {
    pNVar2->_vptr_Node = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pNVar2;
  }
  else if (uVar7 < 0x19) {
    pNVar2->_vptr_Node = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pNVar2;
  }
  else if (uVar7 < 0x21) {
    pNVar2->_vptr_Node = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pNVar2;
  }
  else if (uVar7 < 0x31) {
    pNVar2->_vptr_Node = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pNVar2;
  }
  else if (uVar7 < 0x41) {
    pNVar2->_vptr_Node = (_func_int **)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
    GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pNVar2;
  }
  else {
    operator_delete(pNVar2,0x10);
  }
  return pNVar3;
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }